

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double arcsin_sample(double a,int *seed)

{
  double dVar1;
  double x;
  double cdf;
  int *seed_local;
  double a_local;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = arcsin_cdf_inv(dVar1,a);
  return dVar1;
}

Assistant:

double arcsin_sample ( double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ARCSIN_SAMPLE samples the Arcsin PDF.
//
//  Modified:
//
//    20 March 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the CDF.
//    A must be positive.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double ARCSIN_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = arcsin_cdf_inv ( cdf, a );

  return x;
}